

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O0

S1Angle __thiscall S2::GetPerimeter(S2 *this,S2PointLoopSpan loop)

{
  size_type sVar1;
  ulong uVar2;
  reference x;
  reference y;
  S1Angle local_30;
  int local_24;
  undefined1 auStack_20 [4];
  int i;
  S2PointLoopSpan loop_local;
  S1Angle perimeter;
  
  loop_local.super_S2PointSpan.ptr_ = loop.super_S2PointSpan.ptr_;
  _auStack_20 = this;
  loop_local.super_S2PointSpan.len_ = (size_type)S1Angle::Zero();
  sVar1 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)auStack_20);
  if (1 < sVar1) {
    for (local_24 = 0; uVar2 = (ulong)local_24,
        sVar1 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)auStack_20)
        , uVar2 < sVar1; local_24 = local_24 + 1) {
      x = S2PointLoopSpan::operator[]((S2PointLoopSpan *)auStack_20,local_24);
      y = S2PointLoopSpan::operator[]((S2PointLoopSpan *)auStack_20,local_24 + 1);
      S1Angle::S1Angle(&local_30,x,y);
      S1Angle::operator+=((S1Angle *)&loop_local.super_S2PointSpan.len_,local_30);
    }
  }
  return (S1Angle)(double)loop_local.super_S2PointSpan.len_;
}

Assistant:

S1Angle GetPerimeter(S2PointLoopSpan loop) {
  S1Angle perimeter = S1Angle::Zero();
  if (loop.size() <= 1) return perimeter;
  for (int i = 0; i < loop.size(); ++i) {
    perimeter += S1Angle(loop[i], loop[i + 1]);
  }
  return perimeter;
}